

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O3

SUNErrCode SUNLinSolFree(SUNLinearSolver S)

{
  SUNErrCode SVar1;
  SUNLinearSolver_Ops __ptr;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr = S->ops;
    if ((__ptr != (SUNLinearSolver_Ops)0x0) &&
       (__ptr->free != (_func_SUNErrCode_SUNLinearSolver *)0x0)) {
      SVar1 = (*__ptr->free)(S);
      return SVar1;
    }
    if (S->content != (void *)0x0) {
      free(S->content);
      S->content = (void *)0x0;
      __ptr = S->ops;
    }
    if (__ptr != (SUNLinearSolver_Ops)0x0) {
      free(__ptr);
    }
    free(S);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree(SUNLinearSolver S)
{
  if (S == NULL) { return SUN_SUCCESS; }

  /* if the free operation exists use it */
  if (S->ops)
  {
    if (S->ops->free) { return (S->ops->free(S)); }
  }

  /* if we reach this point, either ops == NULL or free == NULL,
     try to cleanup by freeing the content, ops, and solver */
  if (S->content)
  {
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;

  return SUN_SUCCESS;
}